

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode.cpp
# Opt level: O0

ScalarFunction * duckdb::UrlEncodeFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  allocator_type *in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffed0;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  LogicalType *local_d0;
  LogicalType local_b0 [24];
  undefined1 local_98 [32];
  LogicalType local_78 [40];
  LogicalType *local_50;
  LogicalType local_48 [24];
  LogicalType *local_30;
  undefined8 local_28;
  undefined1 local_20 [32];
  
  local_50 = local_48;
  duckdb::LogicalType::LogicalType(local_50,VARCHAR);
  local_30 = local_48;
  local_28 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe93e69);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffee0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffed8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffee4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffed0,iVar1,in_stack_fffffffffffffec8);
  duckdb::LogicalType::LogicalType(local_78,VARCHAR);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
            );
  duckdb::LogicalType::LogicalType(local_b0,INVALID);
  duckdb::ScalarFunction::ScalarFunction(in_RDI,local_20,local_78,local_98,0,0,0,0,local_b0,0,0,0);
  duckdb::LogicalType::~LogicalType(local_b0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe93f40);
  duckdb::LogicalType::~LogicalType(local_78);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe93f5a);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe93f67);
  local_d0 = (LogicalType *)&local_30;
  do {
    local_d0 = local_d0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_d0);
  } while (local_d0 != local_48);
  return in_RDI;
}

Assistant:

ScalarFunction UrlEncodeFun::GetFunction() {
	return ScalarFunction({LogicalType::VARCHAR}, LogicalType::VARCHAR, URLEncodeFunction);
}